

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Value * __thiscall cashew::Value::setArray(Value *this,size_t size_hint)

{
  ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this_00;
  
  free(this,(void *)size_hint);
  this->type = Array;
  this_00 = (ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *)
            MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  this_00->data = (Ref *)0x0;
  this_00->usedElements = 0;
  this_00->allocatedElements = 0;
  (this->field_1).arr = (ArrayStorage *)this_00;
  if (this_00->allocatedElements < size_hint) {
    ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::reallocate(this_00,size_hint);
  }
  return this;
}

Assistant:

Value& setArray(size_t size_hint = 0) {
    free();
    type = Array;
    arr = arena.alloc<ArrayStorage>();
    arr->reserve(size_hint);
    return *this;
  }